

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O3

int __thiscall deci::ast_binary_t::Generate(ast_binary_t *this,ostream *output,int pc)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 in_register_00000014;
  
  uVar1 = (*this->a->_vptr_ast_item_t[2])(this->a,output,CONCAT44(in_register_00000014,pc));
  iVar2 = (*this->b->_vptr_ast_item_t[2])(this->b,output,(ulong)uVar1);
  std::__ostream_insert<char,std::char_traits<char>>(output,"bin ",4);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (output,(this->identifier)._M_dataplus._M_p,(this->identifier)._M_string_length
                     );
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return iVar2 + 1;
}

Assistant:

int ast_binary_t::Generate(std::ostream& output, int pc) const {
    pc = this->a->Generate(output, pc);
    pc = this->b->Generate(output, pc);
    output << "bin " << this->identifier << std::endl;
    return pc + 1;
  }